

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O3

bool __thiscall BinaryModelSerialiser::loadModel(BinaryModelSerialiser *this,QIODevice *source)

{
  AbstractModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QDataStream reader;
  QDataStream aQStack_38 [24];
  Version local_20;
  
  if (((source != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)source + 0x68))(source,1), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isReadable(), cVar1 != '\0')))) &&
     (this_00 = (this->super_AbstractModelSerialiser).d_ptr.d,
     this_00->m_model != (QAbstractItemModel *)0x0)) {
    QDataStream::QDataStream(aQStack_38,source);
    local_20 = ((AbstractModelSerialiserPrivate *)&this_00->m_streamVersion)->m_streamVersion;
    bVar2 = BinaryModelSerialiserPrivate::readBinary
                      ((BinaryModelSerialiserPrivate *)this_00,aQStack_38);
    QDataStream::~QDataStream(aQStack_38);
    return bVar2;
  }
  return false;
}

Assistant:

bool BinaryModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(BinaryModelSerialiser);
    if (!d->m_model)
        return false;
    QDataStream reader(source);
    reader.setVersion(d->m_streamVersion);
    return d->readBinary(reader);
}